

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O3

Result __thiscall wabt::ExprVisitor::VisitExpr(ExprVisitor *this,Expr *root_expr)

{
  pointer *ppSVar1;
  pointer *pppEVar2;
  pointer *ppiVar3;
  uint uVar4;
  pointer piVar5;
  pointer puVar6;
  Expr *expr;
  size_t sVar7;
  int iVar8;
  Result RVar9;
  pointer pSVar10;
  pointer pSVar11;
  _func_int **pp_Var12;
  pointer ppEVar13;
  pointer piVar14;
  char *pcVar15;
  Index catch_index;
  iterator iVar16;
  
  pSVar10 = (this->state_stack_).
            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar10) {
    (this->state_stack_).
    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar10;
  }
  ppEVar13 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar13) {
    (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar13;
  }
  piVar5 = (this->expr_iter_stack_).
           super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_iter_stack_).
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_finish != piVar5) {
    (this->expr_iter_stack_).
    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
    ._M_impl.super__Vector_impl_data._M_finish = piVar5;
  }
  puVar6 = (this->catch_index_stack_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar6) {
    (this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar6;
  }
  PushDefault(this,root_expr);
  pSVar10 = (this->state_stack_).
            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != pSVar10) {
    do {
      if (Catch < pSVar10[-1]) goto LAB_00161e29;
      pSVar11 = pSVar10 + -1;
      ppEVar13 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      expr = ppEVar13[-1];
      ppEVar13 = ppEVar13 + -1;
      switch(pSVar10[-1]) {
      case Default:
        (this->state_stack_).
        super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
        _M_impl.super__Vector_impl_data._M_finish = pSVar11;
        (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppEVar13;
        RVar9 = HandleDefaultState(this,expr);
        goto LAB_00161e24;
      case Block:
        if (expr->type_ != Block) {
          pcVar15 = 
          "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
          ;
          goto LAB_00161ef9;
        }
        piVar14 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar14[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename._M_str) {
LAB_00161e4a:
          __assert_fail("list_ == rhs.list_",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                        ,0xbf,
                        "bool wabt::intrusive_list<wabt::Expr>::iterator::operator!=(iterator) const [T = wabt::Expr]"
                       );
        }
        if (piVar14[-1].node_ != (Expr *)0x0) {
LAB_00161dc1:
          piVar14 = piVar14 + -1;
LAB_00161dc5:
          iVar16 = intrusive_list<wabt::Expr>::iterator::operator++(piVar14,0);
          if (iVar16.node_ == (Expr *)0x0) {
            __assert_fail("node_",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                          ,0x99,
                          "reference wabt::intrusive_list<wabt::Expr>::iterator::operator*() const [T = wabt::Expr]"
                         );
          }
          PushDefault(this,iVar16.node_);
          goto LAB_00161e29;
        }
        iVar8 = (*this->delegate_->_vptr_Delegate[4])();
        break;
      case IfTrue:
        if (expr->type_ != If) {
LAB_00161e88:
          pcVar15 = "Derived *wabt::cast(Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
LAB_00161ef9:
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                        ,0x4e,pcVar15);
        }
        piVar14 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar14[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename._M_str)
        goto LAB_00161e4a;
        if (piVar14[-1].node_ != (Expr *)0x0) goto LAB_00161dc1;
        iVar8 = (*this->delegate_->_vptr_Delegate[0x15])(this->delegate_,expr);
        if (iVar8 == 1) {
          return (Result)Error;
        }
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        ppiVar3 = &(this->expr_iter_stack_).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar3 = *ppiVar3 + -1;
        PushExprlist(this,IfFalse,expr,(ExprList *)&expr[4].loc);
        goto LAB_00161e29;
      case IfFalse:
        if (expr->type_ != If) goto LAB_00161e88;
        piVar14 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((Location *)piVar14[-1].list_ != &expr[4].loc) goto LAB_00161e4a;
        if (piVar14[-1].node_ != (Expr *)0x0) goto LAB_00161dc1;
        iVar8 = (*this->delegate_->_vptr_Delegate[0x16])();
        break;
      case Loop:
        if (expr->type_ != Loop) {
          pcVar15 = 
          "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
          ;
          goto LAB_00161ef9;
        }
        piVar14 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar14[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename._M_str)
        goto LAB_00161e4a;
        if (piVar14[-1].node_ != (Expr *)0x0) goto LAB_00161dc1;
        iVar8 = (*this->delegate_->_vptr_Delegate[0x1c])();
        break;
      case Try:
        if (expr->type_ != Try) {
LAB_00161e9f:
          pcVar15 = "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]";
          goto LAB_00161ef9;
        }
        piVar5 = (this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar5[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename._M_str)
        goto LAB_00161e4a;
        piVar14 = piVar5 + -1;
        if (piVar5[-1].node_ != (Expr *)0x0) goto LAB_00161dc5;
        (this->state_stack_).
        super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
        _M_impl.super__Vector_impl_data._M_finish = pSVar11;
        (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppEVar13;
        (this->expr_iter_stack_).
        super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
        ._M_impl.super__Vector_impl_data._M_finish = piVar14;
        iVar8 = *(int *)&expr->field_0x3c;
        if (iVar8 == 0) {
LAB_00161e04:
          pp_Var12 = this->delegate_->_vptr_Delegate;
        }
        else {
          if (iVar8 == 2) {
            RVar9.enum_ = (*this->delegate_->_vptr_Delegate[0x38])();
            goto LAB_00161e24;
          }
          if (iVar8 != 1) goto LAB_00161e29;
          pcVar15 = (char *)expr[4].loc.filename._M_len;
          pp_Var12 = this->delegate_->_vptr_Delegate;
          if (pcVar15 != expr[4].loc.filename._M_str) {
            iVar8 = (*pp_Var12[0x37])(this->delegate_,expr,pcVar15);
            if (iVar8 == 1) {
              return (Result)Error;
            }
            catch_index = 0;
            goto LAB_00161d90;
          }
        }
        RVar9.enum_ = (*pp_Var12[0x39])();
LAB_00161e24:
        if (RVar9.enum_ == Error) {
          return (Result)Error;
        }
        goto LAB_00161e29;
      case TryTable:
        if (expr->type_ != TryTable) {
          pcVar15 = "Derived *wabt::cast(Base *) [Derived = wabt::TryTableExpr, Base = wabt::Expr]";
          goto LAB_00161ef9;
        }
        piVar14 = (this->expr_iter_stack_).
                  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar14[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename._M_str)
        goto LAB_00161e4a;
        if (piVar14[-1].node_ != (Expr *)0x0) goto LAB_00161dc1;
        iVar8 = (*this->delegate_->_vptr_Delegate[9])();
        break;
      case Catch:
        if (expr->type_ != Try) goto LAB_00161e9f;
        piVar5 = (this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar6 = (this->catch_index_stack_).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar4 = puVar6[-1];
        sVar7 = expr[4].loc.filename._M_len;
        if (piVar5[-1].list_ != (intrusive_list<wabt::Expr> *)((ulong)uVar4 * 0x80 + sVar7 + 0x68))
        goto LAB_00161e4a;
        piVar14 = piVar5 + -1;
        if (piVar5[-1].node_ != (Expr *)0x0) goto LAB_00161dc5;
        (this->state_stack_).
        super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
        _M_impl.super__Vector_impl_data._M_finish = pSVar11;
        (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppEVar13;
        (this->expr_iter_stack_).
        super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
        ._M_impl.super__Vector_impl_data._M_finish = piVar14;
        (this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar6 + -1;
        catch_index = uVar4 + 1;
        if ((ulong)((long)((long)expr[4].loc.filename._M_str - sVar7) >> 7) <= (ulong)catch_index)
        goto LAB_00161e04;
        pcVar15 = (char *)(sVar7 + (ulong)catch_index * 0x80);
        iVar8 = (*this->delegate_->_vptr_Delegate[0x37])(this->delegate_,expr,pcVar15);
        if (iVar8 == 1) {
          return (Result)Error;
        }
LAB_00161d90:
        PushCatch(this,expr,catch_index,(ExprList *)(pcVar15 + 0x68));
        goto LAB_00161e29;
      }
      if (iVar8 == 1) {
        return (Result)Error;
      }
      ppSVar1 = &(this->state_stack_).
                 super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      pppEVar2 = &(this->expr_stack_).
                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar2 = *pppEVar2 + -1;
      ppiVar3 = &(this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppiVar3 = *ppiVar3 + -1;
LAB_00161e29:
      pSVar10 = (this->state_stack_).
                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->state_stack_).
             super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
             ._M_impl.super__Vector_impl_data._M_start != pSVar10);
  }
  return (Result)Ok;
}

Assistant:

Result ExprVisitor::VisitExpr(Expr* root_expr) {
  state_stack_.clear();
  expr_stack_.clear();
  expr_iter_stack_.clear();
  catch_index_stack_.clear();

  PushDefault(root_expr);

  while (!state_stack_.empty()) {
    State state = state_stack_.back();
    auto* expr = expr_stack_.back();

    switch (state) {
      case State::Default:
        PopDefault();
        CHECK_RESULT(HandleDefaultState(expr));
        break;

      case State::Block: {
        auto block_expr = cast<BlockExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != block_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndBlockExpr(block_expr));
          PopExprlist();
        }
        break;
      }

      case State::IfTrue: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->true_.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->AfterIfTrueExpr(if_expr));
          PopExprlist();
          PushExprlist(State::IfFalse, expr, if_expr->false_);
        }
        break;
      }

      case State::IfFalse: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->false_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndIfExpr(if_expr));
          PopExprlist();
        }
        break;
      }

      case State::Loop: {
        auto loop_expr = cast<LoopExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != loop_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndLoopExpr(loop_expr));
          PopExprlist();
        }
        break;
      }

      case State::TryTable: {
        auto try_table_expr = cast<TryTableExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_table_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndTryTableExpr(try_table_expr));
          PopExprlist();
        }
        break;
      }

      case State::Try: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          PopExprlist();
          switch (try_expr->kind) {
            case TryKind::Catch:
              if (!try_expr->catches.empty()) {
                Catch& catch_ = try_expr->catches[0];
                CHECK_RESULT(delegate_->OnCatchExpr(try_expr, &catch_));
                PushCatch(expr, 0, catch_.exprs);
              } else {
                CHECK_RESULT(delegate_->EndTryExpr(try_expr));
              }
              break;
            case TryKind::Delegate:
              CHECK_RESULT(delegate_->OnDelegateExpr(try_expr));
              break;
            case TryKind::Plain:
              CHECK_RESULT(delegate_->EndTryExpr(try_expr));
              break;
          }
        }
        break;
      }

      case State::Catch: {
        auto try_expr = cast<TryExpr>(expr);
        Index catch_index = catch_index_stack_.back();
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->catches[catch_index].exprs.end()) {
          PushDefault(&*iter++);
        } else {
          PopCatch();
          catch_index++;
          if (catch_index < try_expr->catches.size()) {
            Catch& catch_ = try_expr->catches[catch_index];
            CHECK_RESULT(delegate_->OnCatchExpr(try_expr, &catch_));
            PushCatch(expr, catch_index, catch_.exprs);
          } else {
            CHECK_RESULT(delegate_->EndTryExpr(try_expr));
          }
        }
        break;
      }
    }
  }

  return Result::Ok;
}